

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketProcessor.cpp
# Opt level: O3

bool __thiscall PacketProcessor::findHeader(PacketProcessor *this)

{
  long lVar1;
  pointer puVar2;
  ulong uVar3;
  pointer puVar4;
  ulong uVar5;
  bool bVar6;
  
  bVar6 = true;
  if (this->findHeader_ == false) {
    puVar4 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar3 = (long)puVar2 - (long)puVar4;
    if (uVar3 != 0) {
      bVar6 = true;
      uVar5 = 1;
      do {
        if (*puVar4 == 'Z') {
          if (uVar3 <= uVar5) {
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->buffer_,
                       puVar2 + -1);
            uVar3 = 0;
            goto LAB_0010429b;
          }
          if (puVar4[1] == 0xa5) {
            if (uVar5 != 1) {
              std::vector<unsigned_char,std::allocator<unsigned_char>>::
              _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->buffer_);
            }
            this->findHeader_ = true;
            uVar3 = 1;
            goto LAB_0010429b;
          }
        }
        bVar6 = uVar5 < uVar3;
        puVar4 = puVar4 + 1;
        lVar1 = (-(ulong)(uVar3 == 0) - uVar3) + uVar5;
        uVar5 = uVar5 + 1;
      } while (lVar1 != 0);
    }
    bVar6 = false;
LAB_0010429b:
    bVar6 = (bool)(bVar6 & (byte)uVar3);
  }
  return bVar6;
}

Assistant:

bool PacketProcessor::findHeader() {
  if (findHeader_) return true;

  FOR(i, buffer_.size()) {
    if (buffer_[i] == H_1) {
      if (i + 1 < buffer_.size()) {
        if (buffer_[i + 1] == H_2) {
          if (i != 0) {
            buffer_.assign(buffer_.cbegin() + i, buffer_.cend());
          }
          findHeader_ = true;
          return true;
        }
      } else {
        buffer_.assign(buffer_.cend() - 1, buffer_.cend());
        return false;
      }
    }
  }

  return false;
}